

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pager_playback(Pager *pPager,int isHot)

{
  char *zMaster_00;
  uint local_50;
  int local_4c;
  int nPlayback;
  int needPagerReset;
  char *zMaster;
  int local_38;
  int res;
  int rc;
  Pgno mxPg;
  u32 u;
  u32 nRec;
  i64 szJ;
  sqlite3_vfs *pVfs;
  Pager *pPStack_10;
  int isHot_local;
  Pager *pPager_local;
  
  szJ = (i64)pPager->pVfs;
  res = 0;
  zMaster._4_4_ = 1;
  local_50 = 0;
  pVfs._4_4_ = isHot;
  pPStack_10 = pPager;
  local_38 = sqlite3OsFileSize(pPager->jfd,(i64 *)&u);
  if (local_38 == 0) {
    zMaster_00 = pPStack_10->pTmpSpace;
    local_38 = readMasterJournal(pPStack_10->jfd,zMaster_00,pPStack_10->pVfs->mxPathname + 1);
    if ((local_38 == 0) && (*zMaster_00 != '\0')) {
      local_38 = sqlite3OsAccess((sqlite3_vfs *)szJ,zMaster_00,0,(int *)((long)&zMaster + 4));
    }
    if ((local_38 == 0) && (zMaster._4_4_ != 0)) {
      pPStack_10->journalOff = 0;
      local_4c = pVfs._4_4_;
LAB_0012eac9:
      local_38 = readJournalHdr(pPStack_10,pVfs._4_4_,_u,&mxPg,(u32 *)&res);
      if (local_38 == 0) {
        if (mxPg == 0xffffffff) {
          mxPg = (Pgno)((long)(_u - (ulong)pPStack_10->sectorSize) /
                       (long)(pPStack_10->pageSize + 8));
        }
        if (((mxPg == 0) && (pVfs._4_4_ == 0)) &&
           (pPStack_10->journalHdr + (ulong)pPStack_10->sectorSize == pPStack_10->journalOff)) {
          mxPg = (Pgno)((_u - pPStack_10->journalOff) / (long)(pPStack_10->pageSize + 8));
        }
        if (pPStack_10->journalOff == (ulong)pPStack_10->sectorSize) {
          local_38 = pager_truncate(pPStack_10,res);
          if (local_38 != 0) goto LAB_0012ec48;
          pPStack_10->dbSize = res;
        }
        local_38 = 0;
        for (rc = 0; (uint)rc < mxPg; rc = rc + 1) {
          if (local_4c != 0) {
            pager_reset(pPStack_10);
            local_4c = 0;
          }
          local_38 = pager_playback_one_page(pPStack_10,&pPStack_10->journalOff,(Bitvec *)0x0,1,0);
          if (local_38 != 0) {
            if (local_38 != 0x65) {
              if (local_38 == 0x20a) {
                local_38 = 0;
              }
              goto LAB_0012ec48;
            }
            pPStack_10->journalOff = _u;
            break;
          }
          local_50 = local_50 + 1;
        }
        goto LAB_0012eac9;
      }
      if (local_38 == 0x65) {
        local_38 = 0;
      }
    }
  }
LAB_0012ec48:
  _nPlayback = (char *)0x0;
  pPStack_10->changeCountDone = pPStack_10->tempFile;
  if (local_38 == 0) {
    _nPlayback = pPStack_10->pTmpSpace;
    local_38 = readMasterJournal(pPStack_10->jfd,_nPlayback,pPStack_10->pVfs->mxPathname + 1);
  }
  if ((local_38 == 0) && ((3 < pPStack_10->eState || (pPStack_10->eState == '\0')))) {
    local_38 = sqlite3PagerSync(pPStack_10,(char *)0x0);
  }
  if (local_38 == 0) {
    local_38 = pager_end_transaction(pPStack_10,(uint)(*_nPlayback != '\0'),0);
  }
  if (((local_38 == 0) && (*_nPlayback != '\0')) && (zMaster._4_4_ != 0)) {
    local_38 = pager_delmaster(pPStack_10,_nPlayback);
  }
  if ((pVfs._4_4_ != 0) && (local_50 != 0)) {
    sqlite3_log(0x21b,"recovered %d pages from %s",(ulong)local_50,pPStack_10->zJournal);
  }
  setSectorSize(pPStack_10);
  return local_38;
}

Assistant:

static int pager_playback(Pager *pPager, int isHot){
  sqlite3_vfs *pVfs = pPager->pVfs;
  i64 szJ;                 /* Size of the journal file in bytes */
  u32 nRec;                /* Number of Records in the journal */
  u32 u;                   /* Unsigned loop counter */
  Pgno mxPg = 0;           /* Size of the original file in pages */
  int rc;                  /* Result code of a subroutine */
  int res = 1;             /* Value returned by sqlite3OsAccess() */
  char *zMaster = 0;       /* Name of master journal file if any */
  int needPagerReset;      /* True to reset page prior to first page rollback */
  int nPlayback = 0;       /* Total number of pages restored from journal */

  /* Figure out how many records are in the journal.  Abort early if
  ** the journal is empty.
  */
  assert( isOpen(pPager->jfd) );
  rc = sqlite3OsFileSize(pPager->jfd, &szJ);
  if( rc!=SQLITE_OK ){
    goto end_playback;
  }

  /* Read the master journal name from the journal, if it is present.
  ** If a master journal file name is specified, but the file is not
  ** present on disk, then the journal is not hot and does not need to be
  ** played back.
  **
  ** TODO: Technically the following is an error because it assumes that
  ** buffer Pager.pTmpSpace is (mxPathname+1) bytes or larger. i.e. that
  ** (pPager->pageSize >= pPager->pVfs->mxPathname+1). Using os_unix.c,
  ** mxPathname is 512, which is the same as the minimum allowable value
  ** for pageSize.
  */
  zMaster = pPager->pTmpSpace;
  rc = readMasterJournal(pPager->jfd, zMaster, pPager->pVfs->mxPathname+1);
  if( rc==SQLITE_OK && zMaster[0] ){
    rc = sqlite3OsAccess(pVfs, zMaster, SQLITE_ACCESS_EXISTS, &res);
  }
  zMaster = 0;
  if( rc!=SQLITE_OK || !res ){
    goto end_playback;
  }
  pPager->journalOff = 0;
  needPagerReset = isHot;

  /* This loop terminates either when a readJournalHdr() or 
  ** pager_playback_one_page() call returns SQLITE_DONE or an IO error 
  ** occurs. 
  */
  while( 1 ){
    /* Read the next journal header from the journal file.  If there are
    ** not enough bytes left in the journal file for a complete header, or
    ** it is corrupted, then a process must have failed while writing it.
    ** This indicates nothing more needs to be rolled back.
    */
    rc = readJournalHdr(pPager, isHot, szJ, &nRec, &mxPg);
    if( rc!=SQLITE_OK ){ 
      if( rc==SQLITE_DONE ){
        rc = SQLITE_OK;
      }
      goto end_playback;
    }

    /* If nRec is 0xffffffff, then this journal was created by a process
    ** working in no-sync mode. This means that the rest of the journal
    ** file consists of pages, there are no more journal headers. Compute
    ** the value of nRec based on this assumption.
    */
    if( nRec==0xffffffff ){
      assert( pPager->journalOff==JOURNAL_HDR_SZ(pPager) );
      nRec = (int)((szJ - JOURNAL_HDR_SZ(pPager))/JOURNAL_PG_SZ(pPager));
    }

    /* If nRec is 0 and this rollback is of a transaction created by this
    ** process and if this is the final header in the journal, then it means
    ** that this part of the journal was being filled but has not yet been
    ** synced to disk.  Compute the number of pages based on the remaining
    ** size of the file.
    **
    ** The third term of the test was added to fix ticket #2565.
    ** When rolling back a hot journal, nRec==0 always means that the next
    ** chunk of the journal contains zero pages to be rolled back.  But
    ** when doing a ROLLBACK and the nRec==0 chunk is the last chunk in
    ** the journal, it means that the journal might contain additional
    ** pages that need to be rolled back and that the number of pages 
    ** should be computed based on the journal file size.
    */
    if( nRec==0 && !isHot &&
        pPager->journalHdr+JOURNAL_HDR_SZ(pPager)==pPager->journalOff ){
      nRec = (int)((szJ - pPager->journalOff) / JOURNAL_PG_SZ(pPager));
    }

    /* If this is the first header read from the journal, truncate the
    ** database file back to its original size.
    */
    if( pPager->journalOff==JOURNAL_HDR_SZ(pPager) ){
      rc = pager_truncate(pPager, mxPg);
      if( rc!=SQLITE_OK ){
        goto end_playback;
      }
      pPager->dbSize = mxPg;
    }

    /* Copy original pages out of the journal and back into the 
    ** database file and/or page cache.
    */
    for(u=0; u<nRec; u++){
      if( needPagerReset ){
        pager_reset(pPager);
        needPagerReset = 0;
      }
      rc = pager_playback_one_page(pPager,&pPager->journalOff,0,1,0);
      if( rc==SQLITE_OK ){
        nPlayback++;
      }else{
        if( rc==SQLITE_DONE ){
          pPager->journalOff = szJ;
          break;
        }else if( rc==SQLITE_IOERR_SHORT_READ ){
          /* If the journal has been truncated, simply stop reading and
          ** processing the journal. This might happen if the journal was
          ** not completely written and synced prior to a crash.  In that
          ** case, the database should have never been written in the
          ** first place so it is OK to simply abandon the rollback. */
          rc = SQLITE_OK;
          goto end_playback;
        }else{
          /* If we are unable to rollback, quit and return the error
          ** code.  This will cause the pager to enter the error state
          ** so that no further harm will be done.  Perhaps the next
          ** process to come along will be able to rollback the database.
          */
          goto end_playback;
        }
      }
    }
  }
  /*NOTREACHED*/
  assert( 0 );

end_playback:
  /* Following a rollback, the database file should be back in its original
  ** state prior to the start of the transaction, so invoke the
  ** SQLITE_FCNTL_DB_UNCHANGED file-control method to disable the
  ** assertion that the transaction counter was modified.
  */
#ifdef SQLITE_DEBUG
  if( pPager->fd->pMethods ){
    sqlite3OsFileControlHint(pPager->fd,SQLITE_FCNTL_DB_UNCHANGED,0);
  }
#endif

  /* If this playback is happening automatically as a result of an IO or 
  ** malloc error that occurred after the change-counter was updated but 
  ** before the transaction was committed, then the change-counter 
  ** modification may just have been reverted. If this happens in exclusive 
  ** mode, then subsequent transactions performed by the connection will not
  ** update the change-counter at all. This may lead to cache inconsistency
  ** problems for other processes at some point in the future. So, just
  ** in case this has happened, clear the changeCountDone flag now.
  */
  pPager->changeCountDone = pPager->tempFile;

  if( rc==SQLITE_OK ){
    zMaster = pPager->pTmpSpace;
    rc = readMasterJournal(pPager->jfd, zMaster, pPager->pVfs->mxPathname+1);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN)
  ){
    rc = sqlite3PagerSync(pPager, 0);
  }
  if( rc==SQLITE_OK ){
    rc = pager_end_transaction(pPager, zMaster[0]!='\0', 0);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK && zMaster[0] && res ){
    /* If there was a master journal and this routine will return success,
    ** see if it is possible to delete the master journal.
    */
    rc = pager_delmaster(pPager, zMaster);
    testcase( rc!=SQLITE_OK );
  }
  if( isHot && nPlayback ){
    sqlite3_log(SQLITE_NOTICE_RECOVER_ROLLBACK, "recovered %d pages from %s",
                nPlayback, pPager->zJournal);
  }

  /* The Pager.sectorSize variable may have been updated while rolling
  ** back a journal created by a process with a different sector size
  ** value. Reset it to the correct value for this process.
  */
  setSectorSize(pPager);
  return rc;
}